

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sx_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint in_ECX;
  uint8_t *in_RDX;
  longlong extraout_RDX;
  uint uVar4;
  __m256i *in_RSI;
  void *in_RDI;
  __m256i *in_R8;
  uint in_R9D;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar7 [32];
  undefined8 uVar10;
  __m128i v;
  __m256i *in_stack_00000008;
  __m256i v_m1_b;
  __m256i v_m0_b;
  __m256i v_m0_w;
  __m256i v_al_b;
  __m256i v_rl_b;
  __m256i v_zmask_b;
  __m256i v_maxval_b;
  undefined8 local_380;
  undefined8 uStackY_378;
  __m256i *palVar11;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  void *local_248;
  ulong uStack_238;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar4 = (uint)in_RSI;
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  auVar6 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar6 = vpinsrb_avx(auVar6,0x40,2);
  auVar6 = vpinsrb_avx(auVar6,0x40,3);
  auVar6 = vpinsrb_avx(auVar6,0x40,4);
  auVar6 = vpinsrb_avx(auVar6,0x40,5);
  auVar6 = vpinsrb_avx(auVar6,0x40,6);
  auVar6 = vpinsrb_avx(auVar6,0x40,7);
  auVar6 = vpinsrb_avx(auVar6,0x40,8);
  auVar6 = vpinsrb_avx(auVar6,0x40,9);
  auVar6 = vpinsrb_avx(auVar6,0x40,10);
  auVar6 = vpinsrb_avx(auVar6,0x40,0xb);
  auVar6 = vpinsrb_avx(auVar6,0x40,0xc);
  auVar6 = vpinsrb_avx(auVar6,0x40,0xd);
  auVar6 = vpinsrb_avx(auVar6,0x40,0xe);
  auVar6 = vpinsrb_avx(auVar6,0x40,0xf);
  uStack_170 = auVar6._0_8_;
  uStack_168 = auVar6._8_8_;
  auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar6 = vpinsrw_avx(auVar6,0xff,2);
  auVar6 = vpinsrw_avx(auVar6,0xff,3);
  auVar6 = vpinsrw_avx(auVar6,0xff,4);
  auVar6 = vpinsrw_avx(auVar6,0xff,5);
  auVar6 = vpinsrw_avx(auVar6,0xff,6);
  auVar6 = vpinsrw_avx(auVar6,0xff,7);
  auVar9 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar9 = vpinsrw_avx(auVar9,0xff,2);
  auVar9 = vpinsrw_avx(auVar9,0xff,3);
  auVar9 = vpinsrw_avx(auVar9,0xff,4);
  auVar9 = vpinsrw_avx(auVar9,0xff,5);
  auVar9 = vpinsrw_avx(auVar9,0xff,6);
  auVar9 = vpinsrw_avx(auVar9,0xff,7);
  auVar5 = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar9;
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uStack_70 = auVar9._0_8_;
  uStack_68 = auVar9._8_8_;
  local_248 = in_RDI;
  auVar6 = auVar5;
  do {
    yy_loadu_256(in_stack_00000008,in_RSI);
    in_RSI = in_R8;
    auVar2._16_8_ = auVar9._0_8_;
    auVar2._0_16_ = auVar6;
    auVar2._24_8_ = auVar9._8_8_;
    auVar7 = vpsrldq_avx2(auVar2,1);
    auVar2 = vpavgb_avx2(auVar2,auVar7);
    auVar7._16_8_ = uStack_70;
    auVar7._0_16_ = auVar5;
    auVar7._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar2,auVar7);
    uStack_238 = SUB328(ZEXT832(0),4);
    auVar2 = vpackuswb_avx2(auVar2,ZEXT832(uStack_238) << 0x40);
    auVar3._16_8_ = uStack_170;
    auVar3._0_16_ = auVar1;
    auVar3._24_8_ = uStack_168;
    auVar2 = vpsubb_avx2(auVar3,auVar2);
    auVar6 = auVar2._0_16_;
    palVar11 = in_RSI;
    blend_16_u8_avx2((uint8_t *)CONCAT44(uVar4,in_stack_fffffffffffffdb0),in_RDX,
                     (__m256i *)CONCAT44(in_ECX,in_stack_fffffffffffffda0),in_RSI,in_R9D);
    local_380 = auVar6._0_8_;
    uStackY_378 = auVar6._8_8_;
    uVar8 = 0;
    uVar10 = 0;
    v[1] = extraout_RDX;
    v[0] = (longlong)in_RSI;
    xx_storeu_128(local_248,v);
    auVar9._8_8_ = uVar10;
    auVar9._0_8_ = uVar8;
    auVar6._8_8_ = uStackY_378;
    auVar6._0_8_ = local_380;
    local_248 = (void *)((long)local_248 + (ulong)uVar4);
    in_RDX = in_RDX + in_ECX;
    in_R8 = (__m256i *)((long)*palVar11 + (ulong)in_R9D);
    in_stack_00000008 = (__m256i *)((long)*in_stack_00000008 + ((ulong)mask & 0xffffffff));
    mask_stride = mask_stride - 1;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_sx_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h) {
  const __m256i v_maxval_b = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i v_zmask_b = _mm256_set1_epi16(0xff);
  do {
    const __m256i v_rl_b = yy_loadu_256(mask);
    const __m256i v_al_b =
        _mm256_avg_epu8(v_rl_b, _mm256_srli_si256(v_rl_b, 1));

    const __m256i v_m0_w = _mm256_and_si256(v_al_b, v_zmask_b);
    const __m256i v_m0_b = _mm256_packus_epi16(v_m0_w, _mm256_setzero_si256());
    const __m256i v_m1_b = _mm256_sub_epi8(v_maxval_b, v_m0_b);

    const __m256i v_res_b = blend_16_u8_avx2(src0, src1, &v_m0_b, &v_m1_b,
                                             AOM_BLEND_A64_ROUND_BITS);

    xx_storeu_128(dst, _mm256_castsi256_si128(v_res_b));
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}